

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

InputObject * anon_unknown.dwarf_5d1c2::verifyInput(HelicsInput inp,HelicsError *err)

{
  HelicsError *in_RSI;
  InputObject *in_RDI;
  InputObject *inpObj;
  InputObject *local_8;
  
  if ((in_RSI == (HelicsError *)0x0) || (in_RSI->error_code == 0)) {
    if (in_RDI == (InputObject *)0x0) {
      assignError(in_RSI,-3,"The given input object does not point to a valid object");
      local_8 = (InputObject *)0x0;
    }
    else {
      local_8 = in_RDI;
      if (in_RDI->valid != 0x3456e052) {
        assignError(in_RSI,-3,"The given input object does not point to a valid object");
        local_8 = (InputObject *)0x0;
      }
    }
  }
  else {
    local_8 = (InputObject *)0x0;
  }
  return local_8;
}

Assistant:

helics::InputObject* verifyInput(HelicsInput inp, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (inp == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    auto* inpObj = reinterpret_cast<helics::InputObject*>(inp);
    if (inpObj->valid != InputValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    return inpObj;
}